

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CharClass<unsigned_char> * __thiscall
Centaurus::CharClass<unsigned_char>::operator~
          (CharClass<unsigned_char> *__return_storage_ptr__,CharClass<unsigned_char> *this)

{
  uchar uVar1;
  undefined8 in_RAX;
  pointer pRVar2;
  pointer pRVar3;
  uchar last_end;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  CharClass(__return_storage_ptr__);
  pRVar3 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uStack_38._0_6_ = CONCAT15(1,(undefined5)uStack_38);
  uVar1 = '\x01';
  pRVar2 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pRVar3 != pRVar2) && (pRVar3->m_start == '\x01')) {
    uVar1 = pRVar3->m_end;
    pRVar3 = pRVar3 + 1;
    uStack_38._0_6_ = CONCAT15(uVar1,(undefined5)uStack_38);
  }
  for (; pRVar3 != pRVar2; pRVar3 = pRVar3 + 1) {
    uStack_38._0_7_ = CONCAT16(pRVar3->m_start,(undefined6)uStack_38);
    std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
    emplace_back<unsigned_char&,unsigned_char>
              ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
                *)&__return_storage_ptr__->m_ranges,(uchar *)((long)&uStack_38 + 5),
               (uchar *)((long)&uStack_38 + 6));
    uVar1 = pRVar3->m_end;
    uStack_38._0_6_ = CONCAT15(uVar1,(undefined5)uStack_38);
    pRVar2 = (this->m_ranges).
             super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (uVar1 != 0xff) {
    uStack_38 = CONCAT17(0xff,(undefined7)uStack_38);
    std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
    emplace_back<unsigned_char&,unsigned_char>
              ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
                *)&__return_storage_ptr__->m_ranges,(uchar *)((long)&uStack_38 + 5),
               (uchar *)((long)&uStack_38 + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator~() const
    {
        CharClass<TCHAR> cc;

		typename std::vector<Range<TCHAR> >::const_iterator i = m_ranges.cbegin();
		TCHAR last_end = 1;

		if (i != m_ranges.cend())
		{
			if (i->start() == 1)
			{
				last_end = i->end();
				i++;
			}
		}

		for (; i != m_ranges.cend(); i++)
		{
			cc.m_ranges.emplace_back(last_end, i->start());
			last_end = i->end();
		}

		if (last_end < std::numeric_limits<TCHAR>::max())
			cc.m_ranges.emplace_back(last_end, std::numeric_limits<TCHAR>::max());

        return cc;
    }